

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O2

void __thiscall
TEST_MockSupport_c_failureWithParameterOfTypeCoversValueToString_TestShell::
TEST_MockSupport_c_failureWithParameterOfTypeCoversValueToString_TestShell
          (TEST_MockSupport_c_failureWithParameterOfTypeCoversValueToString_TestShell *this)

{
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_002ddab8;
  return;
}

Assistant:

TEST(MockSupport_c, failureWithParameterOfTypeCoversValueToString)
{
    TestTestingFixture fixture;
    mock_c()->installComparator("typeName", typeNameIsEqual, typeNameValueToString);
    fixture.setTestFunction(failingCallToMockCWithParameterOfType_);
    fixture.runAllTests();
    fixture.assertPrintContains("typeName name: <valueToString>");
    mock_c()->removeAllComparatorsAndCopiers();
}